

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_interpolation_error2(REF_GRID ref_grid,REF_DBL *scalar)

{
  size_t __size;
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  bool bVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  int iVar7;
  REF_DBL *unaff_R13;
  double dVar8;
  REF_DBL integral;
  REF_INT new_cell;
  REF_INT tri_nodes [27];
  REF_DBL node_area [7];
  REF_INT nodes [27];
  uint local_190;
  double local_188;
  double local_168;
  REF_INT local_15c;
  int local_158;
  undefined8 local_154;
  undefined4 local_14c;
  REF_DBL local_e8 [6];
  REF_DBL local_b8 [2];
  int local_a8;
  undefined8 local_a4;
  undefined4 local_90;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[4];
  iVar7 = ref_node->max;
  if ((long)iVar7 < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe9d,
           "ref_metric_interpolation_error2","malloc dist of REF_DBL negative");
    local_190 = 1;
  }
  else {
    __size = (long)iVar7 * 8;
    unaff_R13 = (REF_DBL *)malloc(__size);
    if (unaff_R13 == (REF_DBL *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xe9d,"ref_metric_interpolation_error2","malloc dist of REF_DBL NULL");
      local_190 = 2;
      unaff_R13 = (REF_DBL *)0x0;
    }
    else {
      bVar2 = true;
      pRVar5 = unaff_R13;
      if (iVar7 != 0) {
        pRVar5 = (REF_DBL *)memset(unaff_R13,0,__size);
      }
      local_190 = (uint)pRVar5;
    }
  }
  if (bVar2) {
    if (ref_cell->max < 1) {
      local_188 = 0.0;
    }
    else {
      local_188 = 0.0;
      iVar7 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
        if (RVar3 == 0) {
          iVar1 = ref_cell->node_per;
          if (0 < (long)iVar1) {
            lVar6 = 0;
            do {
              local_e8[lVar6] = scalar[(&local_a8)[lVar6]];
              lVar6 = lVar6 + 1;
            } while (iVar1 != lVar6);
          }
          uVar4 = ref_node_tri_area(ref_node,&local_a8,local_b8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xea3,"ref_metric_interpolation_error2",(ulong)uVar4,"area");
            return uVar4;
          }
          uVar4 = ref_metric_integrate2(ref_metric_integrand_quad_err2,local_e8,&local_168);
          dVar8 = local_168;
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xea6,"ref_metric_interpolation_error2",(ulong)uVar4,"intg");
            return uVar4;
          }
          local_158 = local_a8;
          local_154 = local_a4;
          local_14c = local_90;
          uVar4 = ref_cell_add(ref_grid->cell[3],&local_158,&local_15c);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xeaf,"ref_metric_interpolation_error2",(ulong)uVar4,"add tri");
            return uVar4;
          }
          local_188 = local_188 + dVar8;
          dVar8 = dVar8 / 3.0;
          unaff_R13[local_158] = unaff_R13[local_158] + dVar8;
          unaff_R13[(int)local_154] = unaff_R13[(int)local_154] + dVar8;
          unaff_R13[local_154._4_4_] = dVar8 + unaff_R13[local_154._4_4_];
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < ref_cell->max);
    }
    printf("interpolation error %e\n",local_188);
    uVar4 = ref_gather_scalar_by_extension
                      (ref_grid,1,unaff_R13,(char **)0x0,"ref_metric_test_dist.plt");
    local_190 = 0;
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xeb8,"ref_metric_interpolation_error2",(ulong)uVar4,"dump");
      local_190 = uVar4;
    }
  }
  return local_190;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolation_error2(REF_GRID ref_grid,
                                                   REF_DBL *scalar) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tr2(ref_grid);
  REF_INT cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL node_area[7];
  REF_DBL integral;
  REF_DBL error;
  REF_DBL *dist;

  ref_malloc_init(dist, ref_node_max(ref_node), REF_DBL, 0.0);
  error = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node_area[cell_node] = scalar[nodes[cell_node]];
    }
    RSS(ref_node_tri_area(ref_node, nodes, &(node_area[6])), "area");
    RSS(ref_metric_integrate2(ref_metric_integrand_quad_err2, node_area,
                              &integral),
        "intg");
    error += integral;
    {
      REF_CELL tri_cell = ref_grid_tri(ref_grid);
      REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      tri_nodes[0] = nodes[0];
      tri_nodes[1] = nodes[1];
      tri_nodes[2] = nodes[2];
      tri_nodes[3] = nodes[6];
      RSS(ref_cell_add(tri_cell, tri_nodes, &new_cell), "add tri");
      dist[tri_nodes[0]] += integral / 3.0;
      dist[tri_nodes[1]] += integral / 3.0;
      dist[tri_nodes[2]] += integral / 3.0;
    }
  }
  printf("interpolation error %e\n", error);
  RSS(ref_gather_scalar_by_extension(ref_grid, 1, dist, NULL,
                                     "ref_metric_test_dist.plt"),
      "dump");

  return REF_SUCCESS;
}